

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

size_t bitset_extract_setbits_sse_uint16
                 (uint64_t *words,size_t length,uint16_t *out,size_t outcapacity,uint16_t base)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  short sVar8;
  ulong uVar9;
  byte bVar10;
  ushort uVar11;
  uint16_t *puVar12;
  undefined1 (*pauVar13) [16];
  int r;
  uint64_t t;
  uint64_t w_1;
  uint8_t advanceB;
  uint8_t advanceA;
  __m128i vecB;
  __m128i vecA;
  int local_1dc;
  uint8_t byteB;
  uint8_t byteA;
  uint64_t uStack_1d8;
  int k;
  uint64_t w;
  size_t i;
  int numberofbytes;
  uint16_t *safeout;
  __m128i add8;
  __m128i incVec;
  __m128i baseVec;
  uint16_t *initout;
  uint16_t base_local;
  size_t outcapacity_local;
  uint16_t *out_local;
  size_t length_local;
  uint64_t *words_local;
  
  uVar11 = base - 1;
  auVar6 = vpinsrw_avx(ZEXT216(uVar11),(uint)uVar11,1);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar11,2);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar11,3);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar11,4);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar11,5);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar11,6);
  unique0x000fc480 = vpinsrw_avx(auVar6,(uint)uVar11,7);
  auVar6 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar6 = vpinsrw_avx(auVar6,0x40,2);
  auVar6 = vpinsrw_avx(auVar6,0x40,3);
  auVar6 = vpinsrw_avx(auVar6,0x40,4);
  auVar6 = vpinsrw_avx(auVar6,0x40,5);
  auVar6 = vpinsrw_avx(auVar6,0x40,6);
  auVar6 = vpinsrw_avx(auVar6,0x40,7);
  auVar7 = vpinsrw_avx(ZEXT216(8),8,1);
  auVar7 = vpinsrw_avx(auVar7,8,2);
  auVar7 = vpinsrw_avx(auVar7,8,3);
  auVar7 = vpinsrw_avx(auVar7,8,4);
  auVar7 = vpinsrw_avx(auVar7,8,5);
  auVar7 = vpinsrw_avx(auVar7,8,6);
  auVar7 = vpinsrw_avx(auVar7,8,7);
  puVar12 = out + outcapacity;
  outcapacity_local = (size_t)out;
  for (w = 0; w < length && (uint16_t *)(outcapacity_local + 0x20) <= puVar12; w = w + 1) {
    if (words[w] == 0) {
      unique0x000f8a00 = vpaddw_avx(stack0xfffffffffffffe68,auVar6);
    }
    else {
      uStack_1d8 = words[w];
      for (local_1dc = 0; local_1dc < 4; local_1dc = local_1dc + 1) {
        bVar10 = (byte)(uStack_1d8 >> 8);
        bVar1 = lengthTable[uStack_1d8 & 0xff];
        bVar2 = lengthTable[bVar10];
        auVar3 = vpaddw_avx(stack0xfffffffffffffe68,
                            (undefined1  [16])vecDecodeTable_uint16[uStack_1d8 & 0xff]);
        auVar4 = vpaddw_avx(stack0xfffffffffffffe68,auVar7);
        auVar5 = vpaddw_avx(auVar4,(undefined1  [16])vecDecodeTable_uint16[bVar10]);
        unique0x000f8a00 = vpaddw_avx(auVar4,auVar7);
        vecB[1] = auVar3._0_8_;
        vecA[0] = auVar3._8_8_;
        *(longlong *)outcapacity_local = vecB[1];
        *(longlong *)(outcapacity_local + 8) = vecA[0];
        pauVar13 = (undefined1 (*) [16])(outcapacity_local + (long)(int)(uint)bVar1 * 2);
        *pauVar13 = auVar5;
        outcapacity_local = (size_t)(*pauVar13 + (long)(int)(uint)bVar2 * 2);
        uStack_1d8 = uStack_1d8 >> 0x10;
      }
    }
  }
  initout._6_2_ = base + (short)((w & 0x3ff) << 6);
  for (; w < length && outcapacity_local < puVar12; w = w + 1) {
    for (t = words[w]; t != 0 && outcapacity_local < puVar12;
        t = t & (t ^ 0xffffffffffffffff) + 1 ^ t) {
      sVar8 = 0;
      for (uVar9 = t; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000) {
        sVar8 = sVar8 + 1;
      }
      *(short *)outcapacity_local = sVar8 + initout._6_2_;
      outcapacity_local = outcapacity_local + 2;
    }
    initout._6_2_ = initout._6_2_ + 0x40;
  }
  return (long)(outcapacity_local - (long)out) >> 1;
}

Assistant:

CROARING_TARGET_AVX2
size_t bitset_extract_setbits_sse_uint16(const uint64_t *words, size_t length,
                                         uint16_t *out, size_t outcapacity,
                                         uint16_t base) {
    uint16_t *initout = out;
    __m128i baseVec = _mm_set1_epi16(base - 1);
    __m128i incVec = _mm_set1_epi16(64);
    __m128i add8 = _mm_set1_epi16(8);
    uint16_t *safeout = out + outcapacity;
    const int numberofbytes = 2;  // process two bytes at a time
    size_t i = 0;
    for (; (i < length) && (out + numberofbytes * 8 <= safeout); ++i) {
        uint64_t w = words[i];
        if (w == 0) {
            baseVec = _mm_add_epi16(baseVec, incVec);
        } else {
            for (int k = 0; k < 4; ++k) {
                uint8_t byteA = (uint8_t)w;
                uint8_t byteB = (uint8_t)(w >> 8);
                w >>= 16;
                __m128i vecA = _mm_load_si128(
                    (const __m128i *)vecDecodeTable_uint16[byteA]);
                __m128i vecB = _mm_load_si128(
                    (const __m128i *)vecDecodeTable_uint16[byteB]);
                uint8_t advanceA = lengthTable[byteA];
                uint8_t advanceB = lengthTable[byteB];
                vecA = _mm_add_epi16(baseVec, vecA);
                baseVec = _mm_add_epi16(baseVec, add8);
                vecB = _mm_add_epi16(baseVec, vecB);
                baseVec = _mm_add_epi16(baseVec, add8);
                _mm_storeu_si128((__m128i *)out, vecA);
                out += advanceA;
                _mm_storeu_si128((__m128i *)out, vecB);
                out += advanceB;
            }
        }
    }
    base += (uint16_t)(i * 64);
    for (; (i < length) && (out < safeout); ++i) {
        uint64_t w = words[i];
        while ((w != 0) && (out < safeout)) {
            uint64_t t = w & (~w + 1);
            int r = __builtin_ctzll(w);
            *out = r + base;
            out++;
            w ^= t;
        }
        base += 64;
    }
    return out - initout;
}